

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_element.c
# Opt level: O1

void apx_dataElement_set_type_ref_id(apx_dataElement_t *self,apx_typeId_t type_id)

{
  if (self != (apx_dataElement_t *)0x0) {
    if ((self->type_code == '\x11') && ((self->type_ref).name != (char *)0x0)) {
      free((self->type_ref).name);
    }
    if (self->type_code != '\x10') {
      self->type_code = '\x10';
    }
    (self->type_ref).id = type_id;
  }
  return;
}

Assistant:

void apx_dataElement_set_type_ref_id(apx_dataElement_t* self, apx_typeId_t type_id)
{
   if (self != 0)
   {
      if ( (self->type_code == APX_TYPE_CODE_REF_NAME) && (self->type_ref.name != 0) )
      {
         free(self->type_ref.name);
      }
      if (self->type_code != APX_TYPE_CODE_REF_ID)
      {
         self->type_code = APX_TYPE_CODE_REF_ID;
      }
      self->type_ref.id = type_id;
   }
}